

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>
::
Set_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
          (Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>
           *this,Index columnIndex,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *nonZeroRowIndices,
          map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
          *rowContainer,Column_settings *colSettings)

{
  uint uVar1;
  pointer ppVar2;
  reference value;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
  *this_00;
  uint uVar3;
  int iVar4;
  pair<unsigned_int,_unsigned_int> *p;
  pointer ppVar5;
  _Alloc_node local_48;
  reference local_40;
  const_iterator local_38;
  
  *(Index *)this = columnIndex;
  *(map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
    **)(this + 8) = rowContainer;
  ppVar5 = (nonZeroRowIndices->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = (nonZeroRowIndices->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar4 = (int)((ulong)((long)ppVar5 - (long)ppVar2) >> 3) + -1;
  if (ppVar5 == ppVar2) {
    iVar4 = 0;
  }
  *(int *)(this + 0x10) = iVar4;
  local_38._M_node = (_Base_ptr)(this + 0x20);
  *(undefined4 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(_Base_ptr *)(this + 0x30) = local_38._M_node;
  *(_Base_ptr *)(this + 0x38) = local_38._M_node;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined1 **)(this + 0x50) = &colSettings->field_0x20;
  *(Column_settings **)(this + 0x48) = colSettings;
  ppVar5 = (nonZeroRowIndices->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (nonZeroRowIndices->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar2) {
    do {
      uVar3 = ppVar5->second;
      if (**(uint **)(this + 0x48) <= uVar3) {
        uVar3 = uVar3 % **(uint **)(this + 0x48);
      }
      uVar1 = ppVar5->first;
      local_40 = (reference)operator_new(0x20);
      (local_40->super_Entry_column_index_option).columnIndex_ = *(uint *)this;
      *(undefined8 *)&local_40->super_Entry_field_element_option = 0;
      *(undefined8 *)
       ((long)&(local_40->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ + 4) =
           0;
      *(undefined4 *)
       ((long)&(local_40->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ + 4) =
           0;
      local_40->rowIndex_ = uVar1;
      (local_40->super_Entry_field_element_option).element_ = uVar3;
      local_48._M_t =
           (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*>_>
            *)(this + 0x18);
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>>
      ::
      _M_insert_unique_<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*const&,std::_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>>::_Alloc_node>
                ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>>
                  *)(this + 0x18),local_38,&local_40,&local_48);
      value = local_40;
      local_48._M_t._0_4_ = uVar1;
      if (*(map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
            **)(this + 8) !=
          (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
           *)0x0) {
        this_00 = &std::
                   map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                   ::operator[](*(map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                                  **)(this + 8),(key_type *)&local_48)->super_type;
        boost::intrusive::
        list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
        ::push_back(this_00,value);
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar2);
  }
  return;
}

Assistant:

inline Set_column<Master_matrix>::Set_column(Index columnIndex,
                                             const Container& nonZeroRowIndices,
                                             Row_container* rowContainer,
                                             Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(nonZeroRowIndices.size() == 0 ? 0 : nonZeroRowIndices.size() - 1),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor))
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Constructor not available for chain columns, please specify the dimension of the chain.");

  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _insert_entry(id, column_.end());
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      _insert_entry(operators_->get_value(p.second), p.first, column_.end());
    }
  }
}